

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decodemv.c
# Opt level: O0

int av1_neg_deinterleave(int diff,int ref,int max)

{
  int iVar1;
  int iVar2;
  int max_local;
  int ref_local;
  int diff_local;
  int local_4;
  
  local_4 = diff;
  if (ref != 0) {
    if (ref < max + -1) {
      if (ref * 2 < max) {
        if (diff == ref * 2 || SBORROW4(diff,ref * 2) != diff + ref * -2 < 0) {
          if ((diff & 1U) == 0) {
            local_4 = ref - (diff >> 1);
          }
          else {
            local_4 = ref + (diff + 1 >> 1);
          }
        }
      }
      else {
        iVar1 = (max - ref) + -1;
        iVar2 = iVar1 * 2;
        if (diff == iVar2 || SBORROW4(diff,iVar2) != diff + iVar1 * -2 < 0) {
          if ((diff & 1U) == 0) {
            local_4 = ref - (diff >> 1);
          }
          else {
            local_4 = ref + (diff + 1 >> 1);
          }
        }
        else {
          local_4 = max - (diff + 1);
        }
      }
    }
    else {
      local_4 = (max - diff) + -1;
    }
  }
  return local_4;
}

Assistant:

int av1_neg_deinterleave(int diff, int ref, int max) {
  if (!ref) return diff;
  if (ref >= (max - 1)) return max - diff - 1;
  if (2 * ref < max) {
    if (diff <= 2 * ref) {
      if (diff & 1)
        return ref + ((diff + 1) >> 1);
      else
        return ref - (diff >> 1);
    }
    return diff;
  } else {
    if (diff <= 2 * (max - ref - 1)) {
      if (diff & 1)
        return ref + ((diff + 1) >> 1);
      else
        return ref - (diff >> 1);
    }
    return max - (diff + 1);
  }
}